

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O1

void __thiscall
duckdb::Deserializer::
ReadPropertyWithDefault<std::map<unsigned_long,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>>>
          (Deserializer *this,field_id_t field_id,char *tag,
          map<unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
          *ret)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  undefined6 in_register_00000032;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
  local_58;
  
  uVar2 = (*this->_vptr_Deserializer[4])(this,CONCAT62(in_register_00000032,field_id));
  if ((char)uVar2 == '\0') {
    p_Var1 = &local_58._M_impl.super__Rb_tree_header;
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58._M_impl._0_8_ = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_58._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    ::std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
    ::clear(&ret->_M_t);
    if (local_58._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      (ret->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color =
           local_58._M_impl.super__Rb_tree_header._M_header._M_color;
      (ret->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_58._M_impl.super__Rb_tree_header._M_header._M_parent;
      (ret->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
           local_58._M_impl.super__Rb_tree_header._M_header._M_left;
      (ret->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
           local_58._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_58._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &(ret->_M_t)._M_impl.super__Rb_tree_header._M_header;
      (ret->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
           local_58._M_impl.super__Rb_tree_header._M_node_count;
      local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
  }
  else {
    Read<std::map<unsigned_long,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>>>
              ((type *)&local_58,this);
    ::std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
    ::clear(&ret->_M_t);
    if (local_58._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var1 = &local_58._M_impl.super__Rb_tree_header;
      (ret->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color =
           local_58._M_impl.super__Rb_tree_header._M_header._M_color;
      (ret->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_58._M_impl.super__Rb_tree_header._M_header._M_parent;
      (ret->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
           local_58._M_impl.super__Rb_tree_header._M_header._M_left;
      (ret->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
           local_58._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_58._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &(ret->_M_t)._M_impl.super__Rb_tree_header._M_header;
      (ret->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
           local_58._M_impl.super__Rb_tree_header._M_node_count;
      local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
  }
  ::std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
  ::~_Rb_tree(&local_58);
  (*this->_vptr_Deserializer[5])(this,(ulong)(uVar2 & 0xff));
  return;
}

Assistant:

inline void ReadPropertyWithDefault(const field_id_t field_id, const char *tag, T &ret) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			ret = std::forward<T>(SerializationDefaultValue::GetDefault<T>());
			OnOptionalPropertyEnd(false);
			return;
		}
		ret = Read<T>();
		OnOptionalPropertyEnd(true);
	}